

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O0

void __thiscall InvocationMeaning::Dump(InvocationMeaning *this,ostream *out)

{
  Sexp *this_00;
  Activation *pAVar1;
  bool bVar2;
  reference ppSVar3;
  Sexp *b;
  iterator __end1;
  iterator __begin1;
  vector<Sexp_*,_std::allocator<Sexp_*>_> *__range1;
  ostream *out_local;
  InvocationMeaning *this_local;
  
  bVar2 = Sexp::IsMeaning(this->base);
  if (!bVar2) {
    __assert_fail("base->IsMeaning()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.h"
                  ,0x130,"virtual void InvocationMeaning::Dump(std::ostream &)");
  }
  std::operator<<(out,"(meaning-invocation ");
  Sexp::Dump(this->base,out);
  std::operator<<(out," ");
  __end1 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::begin(&this->arguments);
  b = (Sexp *)std::vector<Sexp_*,_std::allocator<Sexp_*>_>::end(&this->arguments);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>
                                *)&b);
    if (!bVar2) {
      std::operator<<(out,")");
      return;
    }
    ppSVar3 = __gnu_cxx::__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>::
              operator*(&__end1);
    this_00 = *ppSVar3;
    bVar2 = Sexp::IsMeaning(this_00);
    if (!bVar2) break;
    pAVar1 = (this_00->field_1).activation;
    (*(code *)(pAVar1->parent->field_1).symbol_value)(pAVar1,out);
    std::operator<<(out," ");
    __gnu_cxx::__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>::operator++
              (&__end1);
  }
  __assert_fail("b->IsMeaning()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.h"
                ,0x137,"virtual void InvocationMeaning::Dump(std::ostream &)");
}

Assistant:

void Dump(std::ostream &out) override {
    assert(base->IsMeaning());
    out << "(meaning-invocation ";

    base->Dump(out);
    out << " ";

    for (Sexp *b : arguments) {
      assert(b->IsMeaning());
      b->meaning->Dump(out);
      out << " ";
    }

    out << ")";
  }